

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O0

CSVField * __thiscall
csv::CSVRow::operator[](CSVField *__return_storage_ptr__,CSVRow *this,string *col_name)

{
  element_type *peVar1;
  element_type *this_00;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string_view local_38;
  int local_24;
  ColNamesPtr *pCStack_20;
  int col_pos;
  ColNamesPtr *col_names;
  string *col_name_local;
  CSVRow *this_local;
  
  col_names = (ColNamesPtr *)col_name;
  col_name_local = (string *)this;
  peVar1 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  pCStack_20 = &peVar1->col_names;
  this_00 = std::
            __shared_ptr_access<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)pCStack_20);
  local_38 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)col_names);
  local_24 = internals::ColNames::index_of(this_00,local_38);
  if (-1 < local_24) {
    operator[](__return_storage_ptr__,this,(long)local_24);
    return __return_storage_ptr__;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_58,"Can\'t find a column named ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)col_names);
  std::runtime_error::runtime_error(this_01,(string *)&local_58);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CSV_INLINE CSVField CSVRow::operator[](const std::string& col_name) const {
        auto & col_names = this->data->col_names;
        auto col_pos = col_names->index_of(col_name);
        if (col_pos > -1) {
            return this->operator[](col_pos);
        }

        throw std::runtime_error("Can't find a column named " + col_name);
    }